

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O1

void __thiscall PKCS12Test_Order_Test::TestBody(PKCS12Test_Order_Test *this)

{
  undefined1 auVar1 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var3;
  undefined8 uVar4;
  bool bVar5;
  _Head_base<0UL,_x509_st_*,_false> __ptr_00;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> in_04;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> p12;
  UniquePtr<EVP_PKEY> key1;
  UniquePtr<X509> cert3;
  UniquePtr<X509> cert2;
  UniquePtr<X509> cert1;
  UniquePtr<X509> cert1b;
  UniquePtr<EVP_PKEY> key3;
  UniquePtr<EVP_PKEY> key2;
  _Head_base<0UL,_x509_st_*,_false> local_c8;
  _Head_base<0UL,_x509_st_*,_false> local_c0;
  string local_b8;
  AssertHelper local_98;
  _Head_base<0UL,_x509_st_*,_false> local_90;
  _Head_base<0UL,_x509_st_*,_false> local_88;
  _Head_base<0UL,_x509_st_*,_false> local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  pointer local_68;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> local_30;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  
  MakeTestKey();
  local_78[0] = local_58._M_head_impl != (EVP_PKEY *)0x0;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_78,(AssertionResult *)0x546fa0,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x231,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl != (X509 *)0x0) {
      (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
    goto LAB_0035ab1e;
  }
  MakeTestCert((EVP_PKEY *)local_40);
  local_78[0] = (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_40._0_8_ !=
                (x509_st *)0x0;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)local_40._0_8_ == (x509_st *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_78,(AssertionResult *)"cert1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x233,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_90._M_head_impl != (X509 *)0x0) {
      (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
  }
  else {
    MakeTestCert((EVP_PKEY *)(local_40 + 8));
    local_78[0] = (X509 *)local_40._8_8_ != (X509 *)0x0;
    pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_40._8_8_ == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,(internal *)local_78,(AssertionResult *)"cert1b","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x235,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_90._M_head_impl != (X509 *)0x0) {
        (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
      }
      if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_70,pbStack_70);
      }
    }
    else {
      MakeTestKey();
      local_78[0] = local_28._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_28._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_b8,(internal *)local_78,(AssertionResult *)0x555743,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x237,local_b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_90._M_head_impl != (X509 *)0x0) {
          (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
        }
        if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_70,pbStack_70);
        }
      }
      else {
        MakeTestCert((EVP_PKEY *)(local_50 + 8));
        local_78[0] = (X509 *)local_50._8_8_ != (X509 *)0x0;
        pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509 *)local_50._8_8_ == (X509 *)0x0) {
          testing::Message::Message((Message *)&local_90);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b8,(internal *)local_78,(AssertionResult *)"cert2","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x239,local_b8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_90._M_head_impl != (X509 *)0x0) {
            (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
          }
          if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_70,pbStack_70);
          }
        }
        else {
          MakeTestKey();
          local_78[0] = local_30._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                        (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0;
          pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_30._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
              (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_b8,(internal *)local_78,(AssertionResult *)"key3","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x23b,local_b8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c8,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl != (X509 *)0x0) {
              (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
            }
            if (pbStack_70 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_70,pbStack_70);
            }
          }
          else {
            MakeTestCert((EVP_PKEY *)local_50);
            _Var3._M_head_impl = local_58._M_head_impl;
            local_78[0] = (_Head_base<0UL,_x509_st_*,_false>)local_50._0_8_ !=
                          (_Head_base<0UL,_x509_st_*,_false>)0x0;
            pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((_Head_base<0UL,_x509_st_*,_false>)local_50._0_8_ ==
                (_Head_base<0UL,_x509_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&local_90);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_b8,(internal *)local_78,(AssertionResult *)"cert3","false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x23d,local_b8._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_c8,(Message *)&local_90);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_90._M_head_impl != (X509 *)0x0) {
                (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
              }
              if (pbStack_70 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&pbStack_70,pbStack_70);
              }
            }
            else {
              local_78 = (undefined1  [8])0x0;
              pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_68 = (pointer)0x0;
              local_90._M_head_impl = (x509_st *)local_40._0_8_;
              local_88._M_head_impl = (x509_st *)local_50._8_8_;
              local_80._M_head_impl = (x509_st *)local_50._0_8_;
              __l._M_len = 3;
              __l._M_array = &local_90._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l,
                         (allocator_type *)&local_98);
              bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_78,_Var3._M_head_impl,
                                         (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8)
              ;
              local_c8._M_head_impl._0_1_ = (allocator_type)bVar5;
              local_c0._M_head_impl = (X509 *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_b8._M_dataplus._M_p,
                                local_b8.field_2._M_allocated_capacity -
                                (long)local_b8._M_dataplus._M_p);
              }
              if (local_c8._M_head_impl._0_1_ == (allocator_type)0x0) {
                testing::Message::Message((Message *)&local_90);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_b8,(internal *)&local_c8,
                           (AssertionResult *)
                           "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert2.get(), cert3.get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x242,local_b8._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
LAB_0035aa75:
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_c0;
                testing::internal::AssertHelper::~AssertHelper(&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                __ptr_00._M_head_impl = local_c0._M_head_impl;
                if (local_90._M_head_impl != (X509 *)0x0) {
                  (**(code **)(((_Alloc_hider *)&(local_90._M_head_impl)->cert_info)->_M_p + 8))();
                  __ptr_00._M_head_impl = local_c0._M_head_impl;
                }
LAB_0035aaaf:
                if (__ptr_00._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__ptr_00._M_head_impl);
                }
              }
              else {
                if (local_c0._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0._M_head_impl);
                }
                uVar4 = local_40._0_8_;
                _Var3._M_head_impl = local_58._M_head_impl;
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_50._8_8_;
                local_88._M_head_impl = (x509_st *)local_50._0_8_;
                __l_00._M_len = 2;
                __l_00._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_00,
                           (allocator_type *)&local_c8);
                in.size_ = (long)pbVar2 - (long)auVar1;
                in.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in,_Var3._M_head_impl,(X509 *)uVar4,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                _Var3._M_head_impl = local_58._M_head_impl;
                local_90._M_head_impl = (x509_st *)local_50._0_8_;
                local_88._M_head_impl = (x509_st *)local_40._0_8_;
                local_80._M_head_impl = (x509_st *)local_50._8_8_;
                __l_01._M_len = 3;
                __l_01._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_01,
                           (allocator_type *)&local_98);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_78,_Var3._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b8);
                local_c8._M_head_impl._0_1_ = (allocator_type)bVar5;
                local_c0._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                if (local_c8._M_head_impl._0_1_ == (allocator_type)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b8,(internal *)&local_c8,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert3.get(), cert1.get(), cert2.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x246,local_b8._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
                  goto LAB_0035aa75;
                }
                if (local_c0._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0._M_head_impl);
                }
                uVar4 = local_40._0_8_;
                _Var3._M_head_impl = local_58._M_head_impl;
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_50._0_8_;
                local_88._M_head_impl = (x509_st *)local_50._8_8_;
                __l_02._M_len = 2;
                __l_02._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_02,
                           (allocator_type *)&local_c8);
                in_00.size_ = (long)pbVar2 - (long)auVar1;
                in_00.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_00,_Var3._M_head_impl,(X509 *)uVar4,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                _Var3._M_head_impl = local_58._M_head_impl;
                local_90._M_head_impl = (x509_st *)local_50._8_8_;
                local_88._M_head_impl = (x509_st *)local_50._0_8_;
                local_80._M_head_impl = (x509_st *)local_40._0_8_;
                __l_03._M_len = 3;
                __l_03._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_03,
                           (allocator_type *)&local_98);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_78,_Var3._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b8);
                local_c8._M_head_impl._0_1_ = (allocator_type)bVar5;
                local_c0._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                if (local_c8._M_head_impl._0_1_ == (allocator_type)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b8,(internal *)&local_c8,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get(), cert1.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x24a,local_b8._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
                  goto LAB_0035aa75;
                }
                if (local_c0._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0._M_head_impl);
                }
                uVar4 = local_40._0_8_;
                _Var3._M_head_impl = local_58._M_head_impl;
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_50._8_8_;
                local_88._M_head_impl = (x509_st *)local_50._0_8_;
                __l_04._M_len = 2;
                __l_04._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_04,
                           (allocator_type *)&local_c8);
                in_01.size_ = (long)pbVar2 - (long)auVar1;
                in_01.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_01,_Var3._M_head_impl,(X509 *)uVar4,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                _Var3._M_head_impl = local_58._M_head_impl;
                local_c8._M_head_impl = (x509_st *)local_40._0_8_;
                local_c0._M_head_impl = (x509_st *)local_40._8_8_;
                __l_05._M_len = 2;
                __l_05._M_array = &local_c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_05,
                           (allocator_type *)&local_98);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_78,_Var3._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b8);
                local_90._M_head_impl._0_1_ = (internal)bVar5;
                local_88._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                if (local_90._M_head_impl._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b8,(internal *)&local_90,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()})",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x250,local_b8._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c8);
LAB_0035ab90:
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_88;
                  testing::internal::AssertHelper::~AssertHelper(&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  __ptr_00._M_head_impl = local_88._M_head_impl;
                  if (local_c8._M_head_impl != (X509 *)0x0) {
                    (**(code **)(((_Alloc_hider *)&(local_c8._M_head_impl)->cert_info)->_M_p + 8))()
                    ;
                    __ptr_00._M_head_impl = local_88._M_head_impl;
                  }
                  goto LAB_0035aaaf;
                }
                if (local_88._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_88,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88._M_head_impl);
                }
                _Var3._M_head_impl = local_58._M_head_impl;
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_40._0_8_;
                __l_06._M_len = 1;
                __l_06._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_06,
                           (allocator_type *)&local_c8);
                in_02.size_ = (long)pbVar2 - (long)auVar1;
                in_02.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_02,_Var3._M_head_impl,(X509 *)local_40._8_8_,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                local_90._M_head_impl = (x509_st *)local_40._0_8_;
                local_88._M_head_impl = (x509_st *)local_50._8_8_;
                local_80._M_head_impl = (x509_st *)local_50._0_8_;
                __l_07._M_len = 3;
                __l_07._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_07,
                           (allocator_type *)&local_98);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_78,(EVP_PKEY *)0x0,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b8);
                local_c8._M_head_impl._0_1_ = (allocator_type)bVar5;
                local_c0._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                if (local_c8._M_head_impl._0_1_ == (allocator_type)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b8,(internal *)&local_c8,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, nullptr, {cert1.get(), cert2.get(), cert3.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x255,local_b8._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
                  goto LAB_0035aa75;
                }
                if (local_c0._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0._M_head_impl);
                }
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_40._0_8_;
                local_88._M_head_impl = (x509_st *)local_50._8_8_;
                local_80._M_head_impl = (x509_st *)local_50._0_8_;
                __l_08._M_len = 3;
                __l_08._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_08,
                           (allocator_type *)&local_c8);
                in_03.size_ = (long)pbVar2 - (long)auVar1;
                in_03.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_03,(EVP_PKEY *)0x0,(X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                _Var3._M_head_impl = local_58._M_head_impl;
                local_c8._M_head_impl = (x509_st *)local_50._8_8_;
                local_c0._M_head_impl = (x509_st *)local_50._0_8_;
                __l_09._M_len = 2;
                __l_09._M_array = &local_c8._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_09,
                           (allocator_type *)&local_98);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_78,_Var3._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_b8);
                local_90._M_head_impl._0_1_ = (internal)bVar5;
                local_88._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
                if (local_90._M_head_impl._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_c8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_b8,(internal *)&local_90,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()})",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x25a,local_b8._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_c8);
                  goto LAB_0035ab90;
                }
                if (local_88._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_88,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88._M_head_impl);
                }
                pbVar2 = pbStack_70;
                auVar1 = local_78;
                local_90._M_head_impl = (x509_st *)local_50._8_8_;
                local_88._M_head_impl = (x509_st *)local_50._0_8_;
                __l_10._M_len = 2;
                __l_10._M_array = &local_90._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8,__l_10,
                           (allocator_type *)&local_c8);
                in_04.size_ = (long)pbVar2 - (long)auVar1;
                in_04.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_04,local_58._M_head_impl,(X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity -
                                  (long)local_b8._M_dataplus._M_p);
                }
              }
              if (local_78 != (undefined1  [8])0x0) {
                operator_delete((void *)local_78,(long)local_68 - (long)local_78);
              }
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_50);
          }
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_30);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_50 + 8));
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_40 + 8));
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_40);
LAB_0035ab1e:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_58);
  return;
}

Assistant:

TEST(PKCS12Test, Order) {
  bssl::UniquePtr<EVP_PKEY> key1 = MakeTestKey();
  ASSERT_TRUE(key1);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert1b = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1b);
  bssl::UniquePtr<EVP_PKEY> key2 = MakeTestKey();
  ASSERT_TRUE(key2);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key2.get());
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key3 = MakeTestKey();
  ASSERT_TRUE(key3);
  bssl::UniquePtr<X509> cert3 = MakeTestCert(key3.get());
  ASSERT_TRUE(cert3);

  // PKCS12_parse uses the key to select the main certificate.
  std::vector<uint8_t> p12;
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert3.get(), cert1.get(), cert2.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert3.get(), cert2.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert2.get(), cert3.get(), cert1.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  // In case of duplicates, the last one is selected. (It is unlikely anything
  // depends on which is selected, but we match OpenSSL.)
  ASSERT_TRUE(
      PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1b.get(), {cert1.get()});

  // If there is no key, all certificates are returned as "CA" certificates.
  ASSERT_TRUE(PKCS12CreateVector(&p12, nullptr,
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, nullptr, nullptr,
                    {cert1.get(), cert2.get(), cert3.get()});

  // The same happens if there is a key, but it does not match any certificate.
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), nullptr, {cert2.get(), cert3.get()});
}